

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void opj_idwt53_v(opj_dwt_t *dwt,OPJ_INT32 *tiledp_col,OPJ_SIZE_T stride,OPJ_INT32 nb_cols)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  int iVar13;
  OPJ_INT32 *pOVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  OPJ_INT32 *pOVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  ulong uVar12;
  
  iVar7 = dwt->sn;
  lVar18 = (long)iVar7;
  uVar10 = dwt->dn + iVar7;
  uVar12 = (ulong)uVar10;
  if (dwt->cas == 0) {
    if (nb_cols == 8 && 1 < (int)uVar10) {
      pOVar20 = dwt->mem;
      if (((ulong)pOVar20 & 0xf) != 0) {
        __assert_fail("(OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/dwt.c"
                      ,0x29d,
                      "void opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
                     );
      }
      piVar9 = tiledp_col + lVar18 * stride;
      iVar7 = *piVar9;
      iVar36 = piVar9[1];
      iVar6 = piVar9[2];
      iVar11 = piVar9[3];
      piVar9 = tiledp_col + lVar18 * stride + 4;
      iVar21 = *piVar9;
      iVar13 = piVar9[1];
      iVar5 = piVar9[2];
      iVar31 = piVar9[3];
      iVar28 = *tiledp_col - (iVar7 * 2 + 2 >> 2);
      iVar29 = tiledp_col[1] - (iVar36 * 2 + 2 >> 2);
      iVar30 = tiledp_col[2] - (iVar6 * 2 + 2 >> 2);
      iVar32 = tiledp_col[3] - (iVar11 * 2 + 2 >> 2);
      iVar41 = tiledp_col[4] - (iVar21 * 2 + 2 >> 2);
      iVar42 = tiledp_col[5] - (iVar13 * 2 + 2 >> 2);
      iVar43 = tiledp_col[6] - (iVar5 * 2 + 2 >> 2);
      iVar27 = tiledp_col[7] - (iVar31 * 2 + 2 >> 2);
      if (uVar10 < 4) {
        uVar16 = 0;
      }
      else {
        lVar18 = (lVar18 * 4 + 4) * stride;
        lVar17 = 4;
        uVar16 = 0;
        iVar34 = iVar7;
        iVar37 = iVar36;
        iVar39 = iVar6;
        iVar44 = iVar11;
        iVar45 = iVar21;
        iVar46 = iVar13;
        iVar47 = iVar5;
        iVar48 = iVar31;
        iVar23 = iVar41;
        iVar24 = iVar42;
        iVar25 = iVar43;
        iVar26 = iVar27;
        iVar33 = iVar28;
        iVar35 = iVar29;
        iVar38 = iVar30;
        iVar40 = iVar32;
        do {
          piVar1 = tiledp_col + stride + lVar17 + -4;
          piVar9 = tiledp_col + stride + lVar17;
          piVar8 = (int *)((long)tiledp_col + lVar17 * 4 + lVar18 + -0x10);
          iVar7 = *piVar8;
          iVar36 = piVar8[1];
          iVar6 = piVar8[2];
          iVar11 = piVar8[3];
          piVar8 = (int *)((long)tiledp_col + lVar17 * 4 + lVar18);
          iVar21 = *piVar8;
          iVar13 = piVar8[1];
          iVar5 = piVar8[2];
          iVar31 = piVar8[3];
          iVar28 = *piVar1 - (iVar34 + iVar7 + 2 >> 2);
          iVar29 = piVar1[1] - (iVar37 + iVar36 + 2 >> 2);
          iVar30 = piVar1[2] - (iVar39 + iVar6 + 2 >> 2);
          iVar32 = piVar1[3] - (iVar44 + iVar11 + 2 >> 2);
          iVar41 = *piVar9 - (iVar45 + iVar21 + 2 >> 2);
          iVar42 = piVar9[1] - (iVar46 + iVar13 + 2 >> 2);
          iVar43 = piVar9[2] - (iVar47 + iVar5 + 2 >> 2);
          iVar27 = piVar9[3] - (iVar48 + iVar31 + 2 >> 2);
          pOVar14 = pOVar20 + uVar16;
          *pOVar14 = iVar33;
          pOVar14[1] = iVar35;
          pOVar14[2] = iVar38;
          pOVar14[3] = iVar40;
          pOVar14 = pOVar20 + uVar16 + 4;
          *pOVar14 = iVar23;
          pOVar14[1] = iVar24;
          pOVar14[2] = iVar25;
          pOVar14[3] = iVar26;
          pOVar14 = pOVar20 + uVar16 + 8;
          *pOVar14 = (iVar33 + iVar28 >> 1) + iVar34;
          pOVar14[1] = (iVar35 + iVar29 >> 1) + iVar37;
          pOVar14[2] = (iVar38 + iVar30 >> 1) + iVar39;
          pOVar14[3] = (iVar40 + iVar32 >> 1) + iVar44;
          pOVar14 = pOVar20 + uVar16 + 0xc;
          *pOVar14 = (iVar23 + iVar41 >> 1) + iVar45;
          pOVar14[1] = (iVar24 + iVar42 >> 1) + iVar46;
          pOVar14[2] = (iVar25 + iVar43 >> 1) + iVar47;
          pOVar14[3] = (iVar26 + iVar27 >> 1) + iVar48;
          uVar16 = uVar16 + 0x10;
          lVar17 = lVar17 + stride;
          iVar34 = iVar7;
          iVar37 = iVar36;
          iVar39 = iVar6;
          iVar44 = iVar11;
          iVar45 = iVar21;
          iVar46 = iVar13;
          iVar47 = iVar5;
          iVar48 = iVar31;
          iVar23 = iVar41;
          iVar24 = iVar42;
          iVar25 = iVar43;
          iVar26 = iVar27;
          iVar33 = iVar28;
          iVar35 = iVar29;
          iVar38 = iVar30;
          iVar40 = iVar32;
        } while ((ulong)(uVar10 - 4 >> 1) * 0x10 + 0x10 != uVar16);
        uVar16 = uVar16 & 0xffffffff;
      }
      pOVar14 = pOVar20 + uVar16;
      *pOVar14 = iVar28;
      pOVar14[1] = iVar29;
      pOVar14[2] = iVar30;
      pOVar14[3] = iVar32;
      pOVar14 = pOVar20 + uVar16 + 4;
      *pOVar14 = iVar41;
      pOVar14[1] = iVar42;
      pOVar14[2] = iVar43;
      pOVar14[3] = iVar27;
      if ((uVar10 & 1) == 0) {
        uVar16 = (ulong)(uVar10 * 8 - 8);
        pOVar14 = pOVar20 + uVar16;
        *pOVar14 = iVar28 + iVar7;
        pOVar14[1] = iVar29 + iVar36;
        pOVar14[2] = iVar30 + iVar6;
        pOVar14[3] = iVar32 + iVar11;
        pOVar14 = pOVar20 + uVar16 + 4;
        *pOVar14 = iVar41 + iVar21;
        pOVar14[1] = iVar42 + iVar13;
        pOVar14[2] = iVar43 + iVar5;
        pOVar14[3] = iVar27 + iVar31;
      }
      else {
        lVar18 = (uVar10 - 1 >> 1) * stride;
        piVar9 = tiledp_col + lVar18;
        iVar34 = *piVar9 - (iVar7 * 2 + 2 >> 2);
        iVar37 = piVar9[1] - (iVar36 * 2 + 2 >> 2);
        iVar39 = piVar9[2] - (iVar6 * 2 + 2 >> 2);
        iVar44 = piVar9[3] - (iVar11 * 2 + 2 >> 2);
        uVar16 = (ulong)(uVar10 * 8 - 8);
        pOVar14 = pOVar20 + uVar16;
        *pOVar14 = iVar34;
        pOVar14[1] = iVar37;
        pOVar14[2] = iVar39;
        pOVar14[3] = iVar44;
        uVar15 = (ulong)(uVar10 * 8 - 0x10);
        pOVar14 = pOVar20 + uVar15;
        *pOVar14 = (iVar34 + iVar28 >> 1) + iVar7;
        pOVar14[1] = (iVar37 + iVar29 >> 1) + iVar36;
        pOVar14[2] = (iVar39 + iVar30 >> 1) + iVar6;
        pOVar14[3] = (iVar44 + iVar32 >> 1) + iVar11;
        piVar9 = tiledp_col + lVar18 + 4;
        iVar7 = *piVar9 - (iVar21 * 2 + 2 >> 2);
        iVar36 = piVar9[1] - (iVar13 * 2 + 2 >> 2);
        iVar6 = piVar9[2] - (iVar5 * 2 + 2 >> 2);
        iVar11 = piVar9[3] - (iVar31 * 2 + 2 >> 2);
        pOVar14 = pOVar20 + uVar16 + 4;
        *pOVar14 = iVar7;
        pOVar14[1] = iVar36;
        pOVar14[2] = iVar6;
        pOVar14[3] = iVar11;
        pOVar14 = pOVar20 + uVar15 + 4;
        *pOVar14 = (iVar7 + iVar41 >> 1) + iVar21;
        pOVar14[1] = (iVar36 + iVar42 >> 1) + iVar13;
        pOVar14[2] = (iVar6 + iVar43 >> 1) + iVar5;
        pOVar14[3] = (iVar11 + iVar27 >> 1) + iVar31;
      }
      pOVar14 = tiledp_col + 4;
      lVar18 = 0;
      do {
        uVar3 = ((undefined8 *)((long)pOVar20 + lVar18))[1];
        *(undefined8 *)(pOVar14 + -4) = *(undefined8 *)((long)pOVar20 + lVar18);
        *(undefined8 *)(pOVar14 + -2) = uVar3;
        puVar2 = (undefined8 *)((long)pOVar20 + lVar18 + 0x10);
        uVar3 = puVar2[1];
        *(undefined8 *)pOVar14 = *puVar2;
        *(undefined8 *)(pOVar14 + 2) = uVar3;
        lVar18 = lVar18 + 0x20;
        pOVar14 = pOVar14 + stride;
      } while (uVar12 << 5 != lVar18);
    }
    else if (0 < nb_cols && 1 < (int)uVar10) {
      pOVar20 = dwt->mem;
      piVar9 = tiledp_col + stride;
      iVar36 = 0;
      do {
        iVar6 = tiledp_col[lVar18 * stride];
        iVar11 = *tiledp_col - (iVar6 + 1 >> 1);
        if (uVar10 < 4) {
          uVar4 = 0;
        }
        else {
          lVar17 = 0;
          piVar8 = piVar9;
          iVar13 = iVar6;
          iVar5 = iVar11;
          iVar21 = iVar7;
          do {
            iVar21 = iVar21 + 1;
            iVar6 = tiledp_col[(long)iVar21 * stride];
            iVar11 = *piVar8 - (iVar13 + iVar6 + 2 >> 2);
            pOVar20[lVar17] = iVar5;
            pOVar20[lVar17 + 1] = (iVar5 + iVar11 >> 1) + iVar13;
            lVar17 = lVar17 + 2;
            piVar8 = piVar8 + stride;
            iVar13 = iVar6;
            iVar5 = iVar11;
          } while ((ulong)(uVar10 - 4 & 0xfffffffe) + 2 != lVar17);
          uVar4 = (uint)lVar17;
        }
        pOVar20[uVar4] = iVar11;
        lVar17 = -4;
        if ((uVar10 & 1) != 0) {
          iVar21 = tiledp_col[(uVar10 - 1 >> 1) * stride] - (iVar6 + 1 >> 1);
          pOVar20[uVar10 - 1] = iVar21;
          iVar11 = iVar21 + iVar11 >> 1;
          lVar17 = -8;
        }
        *(int *)((long)pOVar20 + lVar17 + uVar12 * 4) = iVar11 + iVar6;
        uVar16 = 0;
        piVar8 = tiledp_col;
        do {
          *piVar8 = pOVar20[uVar16];
          uVar16 = uVar16 + 1;
          piVar8 = piVar8 + stride;
        } while (uVar12 != uVar16);
        iVar36 = iVar36 + 1;
        tiledp_col = tiledp_col + 1;
        piVar9 = piVar9 + 1;
      } while (iVar36 != nb_cols);
    }
  }
  else if (uVar10 == 2) {
    if (0 < nb_cols) {
      pOVar20 = dwt->mem;
      do {
        iVar7 = *tiledp_col - (tiledp_col[lVar18 * stride] + 1 >> 1);
        pOVar20[1] = iVar7;
        iVar7 = iVar7 + tiledp_col[lVar18 * stride];
        *pOVar20 = iVar7;
        *tiledp_col = iVar7;
        tiledp_col[stride] = pOVar20[1];
        tiledp_col = tiledp_col + 1;
        nb_cols = nb_cols + -1;
      } while (nb_cols != 0);
    }
  }
  else if (uVar10 == 1) {
    if (0 < nb_cols) {
      lVar18 = 0;
      do {
        tiledp_col[lVar18] = tiledp_col[lVar18] / 2;
        lVar18 = lVar18 + 1;
      } while (nb_cols != (int)lVar18);
    }
  }
  else if (nb_cols == 8 && 2 < (int)uVar10) {
    pOVar20 = dwt->mem;
    if (((ulong)pOVar20 & 0xf) != 0) {
      __assert_fail("(OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/dwt.c"
                    ,0x303,
                    "void opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
                   );
    }
    piVar9 = tiledp_col + lVar18 * stride;
    piVar8 = piVar9 + stride;
    iVar7 = *piVar8;
    iVar36 = piVar8[1];
    iVar6 = piVar8[2];
    iVar11 = piVar8[3];
    iVar21 = piVar9[1];
    iVar13 = piVar9[2];
    iVar5 = piVar9[3];
    iVar27 = *tiledp_col - (iVar7 + *piVar9 + 2 >> 2);
    iVar28 = tiledp_col[1] - (iVar36 + iVar21 + 2 >> 2);
    iVar29 = tiledp_col[2] - (iVar6 + iVar13 + 2 >> 2);
    iVar30 = tiledp_col[3] - (iVar11 + iVar5 + 2 >> 2);
    *pOVar20 = *piVar9 + iVar27;
    pOVar20[1] = iVar21 + iVar28;
    pOVar20[2] = iVar13 + iVar29;
    pOVar20[3] = iVar5 + iVar30;
    piVar8 = piVar9 + stride + 4;
    iVar21 = *piVar8;
    iVar13 = piVar8[1];
    iVar5 = piVar8[2];
    iVar31 = piVar8[3];
    iVar41 = piVar9[5];
    iVar42 = piVar9[6];
    iVar43 = piVar9[7];
    iVar32 = tiledp_col[4] - (iVar21 + piVar9[4] + 2 >> 2);
    iVar34 = tiledp_col[5] - (iVar13 + iVar41 + 2 >> 2);
    iVar37 = tiledp_col[6] - (iVar5 + iVar42 + 2 >> 2);
    iVar39 = tiledp_col[7] - (iVar31 + iVar43 + 2 >> 2);
    pOVar20[4] = piVar9[4] + iVar32;
    pOVar20[5] = iVar41 + iVar34;
    pOVar20[6] = iVar42 + iVar37;
    pOVar20[7] = iVar43 + iVar39;
    uVar4 = uVar10 & 1 ^ 1;
    uVar16 = 8;
    if (1 < (uVar10 - 2) - uVar4) {
      lVar18 = (lVar18 * 4 + 8) * stride;
      lVar22 = 4;
      lVar17 = 0;
      lVar19 = 0x1000000000;
      iVar41 = iVar7;
      iVar42 = iVar36;
      iVar43 = iVar6;
      iVar44 = iVar11;
      iVar45 = iVar21;
      iVar46 = iVar13;
      iVar47 = iVar5;
      iVar48 = iVar31;
      iVar23 = iVar27;
      iVar24 = iVar28;
      iVar25 = iVar29;
      iVar26 = iVar30;
      iVar33 = iVar32;
      iVar35 = iVar34;
      iVar38 = iVar37;
      iVar40 = iVar39;
      do {
        piVar9 = (int *)((long)tiledp_col + lVar22 * 4 + lVar18 + -0x10);
        iVar7 = *piVar9;
        iVar36 = piVar9[1];
        iVar6 = piVar9[2];
        iVar11 = piVar9[3];
        piVar9 = (int *)((long)tiledp_col + lVar22 * 4 + lVar18);
        iVar21 = *piVar9;
        iVar13 = piVar9[1];
        iVar5 = piVar9[2];
        iVar31 = piVar9[3];
        piVar9 = tiledp_col + stride + lVar22 + -4;
        iVar27 = *piVar9 - (iVar41 + iVar7 + 2 >> 2);
        iVar28 = piVar9[1] - (iVar42 + iVar36 + 2 >> 2);
        iVar29 = piVar9[2] - (iVar43 + iVar6 + 2 >> 2);
        iVar30 = piVar9[3] - (iVar44 + iVar11 + 2 >> 2);
        piVar9 = tiledp_col + stride + lVar22;
        iVar32 = *piVar9 - (iVar45 + iVar21 + 2 >> 2);
        iVar34 = piVar9[1] - (iVar46 + iVar13 + 2 >> 2);
        iVar37 = piVar9[2] - (iVar47 + iVar5 + 2 >> 2);
        iVar39 = piVar9[3] - (iVar48 + iVar31 + 2 >> 2);
        pOVar14 = pOVar20 + lVar17 + 8;
        *pOVar14 = iVar23;
        pOVar14[1] = iVar24;
        pOVar14[2] = iVar25;
        pOVar14[3] = iVar26;
        pOVar14 = pOVar20 + lVar17 + 0xc;
        *pOVar14 = iVar33;
        pOVar14[1] = iVar35;
        pOVar14[2] = iVar38;
        pOVar14[3] = iVar40;
        piVar9 = (int *)((long)pOVar20 + (lVar19 >> 0x1e));
        *piVar9 = (iVar23 + iVar27 >> 1) + iVar41;
        piVar9[1] = (iVar24 + iVar28 >> 1) + iVar42;
        piVar9[2] = (iVar25 + iVar29 >> 1) + iVar43;
        piVar9[3] = (iVar26 + iVar30 >> 1) + iVar44;
        piVar9 = (int *)((long)pOVar20 + (lVar19 >> 0x1e) + 0x10);
        *piVar9 = (iVar33 + iVar32 >> 1) + iVar45;
        piVar9[1] = (iVar35 + iVar34 >> 1) + iVar46;
        piVar9[2] = (iVar38 + iVar37 >> 1) + iVar47;
        piVar9[3] = (iVar40 + iVar39 >> 1) + iVar48;
        lVar19 = lVar19 + 0x1000000000;
        lVar17 = lVar17 + 0x10;
        lVar22 = lVar22 + stride;
        iVar41 = iVar7;
        iVar42 = iVar36;
        iVar43 = iVar6;
        iVar44 = iVar11;
        iVar45 = iVar21;
        iVar46 = iVar13;
        iVar47 = iVar5;
        iVar48 = iVar31;
        iVar23 = iVar27;
        iVar24 = iVar28;
        iVar25 = iVar29;
        iVar26 = iVar30;
        iVar33 = iVar32;
        iVar35 = iVar34;
        iVar38 = iVar37;
        iVar40 = iVar39;
      } while ((ulong)((uVar10 - uVar4) - 4 >> 1) * 0x10 + 0x10 != lVar17);
      uVar16 = (ulong)((int)lVar17 + 8);
    }
    pOVar14 = pOVar20 + uVar16;
    *pOVar14 = iVar27;
    pOVar14[1] = iVar28;
    pOVar14[2] = iVar29;
    pOVar14[3] = iVar30;
    pOVar14 = pOVar20 + uVar16 + 4;
    *pOVar14 = iVar32;
    pOVar14[1] = iVar34;
    pOVar14[2] = iVar37;
    pOVar14[3] = iVar39;
    if ((uVar10 & 1) == 0) {
      lVar18 = ((uVar10 >> 1) - 1) * stride;
      piVar9 = tiledp_col + lVar18;
      iVar45 = *piVar9 - (iVar7 * 2 + 2 >> 2);
      iVar46 = piVar9[1] - (iVar36 * 2 + 2 >> 2);
      iVar47 = piVar9[2] - (iVar6 * 2 + 2 >> 2);
      iVar48 = piVar9[3] - (iVar11 * 2 + 2 >> 2);
      piVar9 = tiledp_col + lVar18 + 4;
      iVar41 = *piVar9 - (iVar21 * 2 + 2 >> 2);
      iVar42 = piVar9[1] - (iVar13 * 2 + 2 >> 2);
      iVar43 = piVar9[2] - (iVar5 * 2 + 2 >> 2);
      iVar44 = piVar9[3] - (iVar31 * 2 + 2 >> 2);
      uVar16 = (ulong)((uVar10 - 2) * 8);
      pOVar14 = pOVar20 + uVar16;
      *pOVar14 = (iVar27 + iVar45 >> 1) + iVar7;
      pOVar14[1] = (iVar28 + iVar46 >> 1) + iVar36;
      pOVar14[2] = (iVar29 + iVar47 >> 1) + iVar6;
      pOVar14[3] = (iVar30 + iVar48 >> 1) + iVar11;
      pOVar14 = pOVar20 + uVar16 + 4;
      *pOVar14 = (iVar32 + iVar41 >> 1) + iVar21;
      pOVar14[1] = (iVar34 + iVar42 >> 1) + iVar13;
      pOVar14[2] = (iVar37 + iVar43 >> 1) + iVar5;
      pOVar14[3] = (iVar39 + iVar44 >> 1) + iVar31;
      uVar16 = (ulong)(uVar10 * 8 - 8);
      pOVar14 = pOVar20 + uVar16;
      *pOVar14 = iVar45;
      pOVar14[1] = iVar46;
      pOVar14[2] = iVar47;
      pOVar14[3] = iVar48;
      pOVar14 = pOVar20 + uVar16 + 4;
      *pOVar14 = iVar41;
      pOVar14[1] = iVar42;
      pOVar14[2] = iVar43;
      pOVar14[3] = iVar44;
    }
    else {
      pOVar14 = pOVar20 + (long)(int)(uVar10 * 8) + -8;
      *pOVar14 = iVar27 + iVar7;
      pOVar14[1] = iVar28 + iVar36;
      pOVar14[2] = iVar29 + iVar6;
      pOVar14[3] = iVar30 + iVar11;
      pOVar14 = pOVar20 + (long)(int)(uVar10 * 8) + -4;
      *pOVar14 = iVar32 + iVar21;
      pOVar14[1] = iVar34 + iVar13;
      pOVar14[2] = iVar37 + iVar5;
      pOVar14[3] = iVar39 + iVar31;
    }
    pOVar14 = tiledp_col + 4;
    lVar18 = 0;
    do {
      uVar3 = ((undefined8 *)((long)pOVar20 + lVar18))[1];
      *(undefined8 *)(pOVar14 + -4) = *(undefined8 *)((long)pOVar20 + lVar18);
      *(undefined8 *)(pOVar14 + -2) = uVar3;
      puVar2 = (undefined8 *)((long)pOVar20 + lVar18 + 0x10);
      uVar3 = puVar2[1];
      *(undefined8 *)pOVar14 = *puVar2;
      *(undefined8 *)(pOVar14 + 2) = uVar3;
      lVar18 = lVar18 + 0x20;
      pOVar14 = pOVar14 + stride;
    } while (uVar12 << 5 != lVar18);
  }
  else if (0 < nb_cols && 2 < (int)uVar10) {
    piVar9 = dwt->mem;
    uVar4 = uVar10 & 1 ^ 1;
    pOVar20 = tiledp_col + stride;
    pOVar14 = (OPJ_INT32 *)((lVar18 * 4 + 8) * stride + (long)tiledp_col);
    iVar7 = 0;
    do {
      iVar36 = (tiledp_col + lVar18 * stride)[stride];
      iVar6 = tiledp_col[lVar18 * stride];
      iVar11 = *tiledp_col - (iVar36 + iVar6 + 2 >> 2);
      *piVar9 = iVar6 + iVar11;
      uVar16 = 1;
      if (1 < (uVar10 - 2) - uVar4) {
        lVar19 = 0;
        lVar17 = 0;
        iVar6 = iVar11;
        iVar21 = iVar36;
        do {
          iVar36 = pOVar14[lVar17];
          iVar11 = pOVar20[lVar17] - (iVar21 + iVar36 + 2 >> 2);
          piVar9[lVar19 + 1] = iVar6;
          piVar9[lVar19 + 2] = (iVar6 + iVar11 >> 1) + iVar21;
          lVar17 = lVar17 + stride;
          lVar19 = lVar19 + 2;
          iVar6 = iVar11;
          iVar21 = iVar36;
        } while ((ulong)((uVar10 - uVar4) - 4 & 0xfffffffe) + 2 != lVar19);
        uVar16 = (ulong)((int)lVar19 + 1);
      }
      piVar9[uVar16] = iVar11;
      if ((uVar10 & 1) == 0) {
        iVar6 = tiledp_col[((uVar10 >> 1) - 1) * stride] - (iVar36 + 1 >> 1);
        piVar9[uVar10 - 2] = (iVar11 + iVar6 >> 1) + iVar36;
      }
      else {
        iVar6 = iVar11 + iVar36;
      }
      piVar9[uVar12 - 1] = iVar6;
      uVar16 = 0;
      piVar8 = tiledp_col;
      do {
        *piVar8 = piVar9[uVar16];
        uVar16 = uVar16 + 1;
        piVar8 = piVar8 + stride;
      } while (uVar12 != uVar16);
      iVar7 = iVar7 + 1;
      tiledp_col = tiledp_col + 1;
      pOVar20 = pOVar20 + 1;
      pOVar14 = pOVar14 + 1;
    } while (iVar7 != nb_cols);
  }
  return;
}

Assistant:

static void opj_idwt53_v(const opj_dwt_t *dwt,
                         OPJ_INT32* tiledp_col,
                         OPJ_SIZE_T stride,
                         OPJ_INT32 nb_cols)
{
#ifdef STANDARD_SLOW_VERSION
    /* For documentation purpose */
    OPJ_INT32 k, c;
    for (c = 0; c < nb_cols; c ++) {
        opj_dwt_interleave_v(dwt, tiledp_col + c, stride);
        opj_dwt_decode_1(dwt);
        for (k = 0; k < dwt->sn + dwt->dn; ++k) {
            tiledp_col[c + k * stride] = dwt->mem[k];
        }
    }
#else
    const OPJ_INT32 sn = dwt->sn;
    const OPJ_INT32 len = sn + dwt->dn;
    if (dwt->cas == 0) {
        /* If len == 1, unmodified value */

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 1 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas0(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    } else {
        if (len == 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                tiledp_col[0] /= 2;
            }
            return;
        }

        if (len == 2) {
            OPJ_INT32 c;
            OPJ_INT32* out = dwt->mem;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                OPJ_INT32 i;
                const OPJ_INT32* in_even = &tiledp_col[(OPJ_SIZE_T)sn * stride];
                const OPJ_INT32* in_odd = &tiledp_col[0];

                out[1] = in_odd[0] - ((in_even[0] + 1) >> 1);
                out[0] = in_even[0] + out[1];

                for (i = 0; i < len; ++i) {
                    tiledp_col[(OPJ_SIZE_T)i * stride] = out[i];
                }
            }

            return;
        }

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 2 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 2) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas1(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    }
#endif
}